

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

shared_ptr<SchemeObject> __thiscall ExecutionResult::force_value(ExecutionResult *this)

{
  TailContext *pTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExecutionResult *in_RSI;
  shared_ptr<SchemeObject> sVar2;
  ExecutionResult EStack_38;
  
  while (in_RSI->type == TAIL_CALL) {
    pTVar1 = (in_RSI->tail_context)._M_t.
             super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
             super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
             super__Head_base<0UL,_TailContext_*,_false>._M_head_impl;
    SchemeProcedure::execute
              (&EStack_38,
               (pTVar1->func).super___shared_ptr<SchemeProcedure,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               ,&pTVar1->args);
    operator=(in_RSI,&EStack_38);
    ~ExecutionResult(&EStack_38);
  }
  std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             &(in_RSI->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<SchemeObject>)
         sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeObject> ExecutionResult::force_value()
{
    while(type == execution_result_t::TAIL_CALL)
    {
        (*this) = tail_context->func->execute(tail_context->args);
    }
    return value;
}